

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboNoAttachmentTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::FramebufferCompletenessCase::~FramebufferCompletenessCase
          (FramebufferCompletenessCase *this)

{
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FramebufferCompletenessCase_00a17ef8;
  tcu::ResultCollector::~ResultCollector(&this->m_results);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

virtual						~FramebufferCompletenessCase	 (void) {}